

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> * __thiscall
glu::sl::ShaderParser::parse
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          ShaderParser *this)

{
  Token TVar1;
  Resource *pRVar2;
  char *pcVar3;
  pointer ppTVar4;
  uint uVar5;
  long *plVar6;
  undefined8 extraout_RAX;
  long *plVar7;
  size_type *psVar8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar5 = (*((this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
             m_data.ptr)->_vptr_Resource[3])();
  std::vector<char,_std::allocator<char>_>::resize(&this->m_input,(long)(int)(uVar5 + 1));
  pRVar2 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
           m_data.ptr;
  (*pRVar2->_vptr_Resource[5])(pRVar2,0);
  pRVar2 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
           m_data.ptr;
  (*pRVar2->_vptr_Resource[2])
            (pRVar2,(this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,(ulong)uVar5);
  (this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)uVar5] = '\0';
  pcVar3 = (char *)(this->m_curTokenStr)._M_string_length;
  this->m_curPtr =
       (this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->m_curToken = TOKEN_INVALID;
  std::__cxx11::string::_M_replace((ulong)&this->m_curTokenStr,0,pcVar3,0xaf21f7);
  advanceToken(this);
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    while( true ) {
      TVar1 = this->m_curToken;
      if ((int)TVar1 < 0xc) break;
      if (TVar1 == TOKEN_IMPORT) {
        parseImport(this,__return_storage_ptr__);
      }
      else {
        if (TVar1 != TOKEN_CASE) goto LAB_00a5daa8;
        parseShaderCase(this,__return_storage_ptr__);
      }
    }
    if (TVar1 != TOKEN_GROUP) break;
    parseShaderGroup(this,__return_storage_ptr__);
  }
  if (TVar1 == TOKEN_EOF) {
    assumeToken(this,TOKEN_EOF);
    return __return_storage_ptr__;
  }
LAB_00a5daa8:
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"invalid token encountered at main level: \'","");
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_48,(ulong)(this->m_curTokenStr)._M_dataplus._M_p);
  local_88 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_88 == plVar7) {
    local_78 = *plVar7;
    lStack_70 = plVar6[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar7;
  }
  local_80 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_68._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_68._M_dataplus._M_p == psVar8) {
    local_68.field_2._M_allocated_capacity = *psVar8;
    local_68.field_2._8_8_ = plVar6[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar8;
  }
  local_68._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  parseError(this,&local_68);
  ppTVar4 = (__return_storage_ptr__->
            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 != (pointer)0x0) {
    operator_delete(ppTVar4,(long)(__return_storage_ptr__->
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  )._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)ppTVar4);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

vector<tcu::TestNode*> ShaderParser::parse (void)
{
	const int	dataLen		= m_resource->getSize();

	m_input.resize(dataLen+1);
	m_resource->setPosition(0);
	m_resource->read((deUint8*)&m_input[0], dataLen);
	m_input[dataLen] = '\0';

	// Initialize parser.
	m_curPtr		= &m_input[0];
	m_curToken		= TOKEN_INVALID;
	m_curTokenStr	= "";
	advanceToken();

	vector<tcu::TestNode*> nodeList;

	// Parse all cases.
	PARSE_DBG(("parse()\n"));
	for (;;)
	{
		if (m_curToken == TOKEN_CASE)
			parseShaderCase(nodeList);
		else if (m_curToken == TOKEN_GROUP)
			parseShaderGroup(nodeList);
		else if (m_curToken == TOKEN_IMPORT)
			parseImport(nodeList);
		else if (m_curToken == TOKEN_EOF)
			break;
		else
			parseError(string("invalid token encountered at main level: '") + m_curTokenStr + "'");
	}

	assumeToken(TOKEN_EOF);
//	printf("  parsed %d test cases.\n", caseList.size());
	return nodeList;
}